

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O2

void __thiscall
groundupdbext::FileKeyValueStore::FileKeyValueStore(FileKeyValueStore *this,string *fullpath)

{
  bool bVar1;
  path local_40;
  
  (this->super_KeyValueStore).super_Store._vptr_Store =
       (_func_int **)&PTR__FileKeyValueStore_00138c40;
  std::make_unique<groundupdbext::FileKeyValueStore::Impl,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mImpl);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_40,fullpath,auto_format);
  bVar1 = std::filesystem::exists(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (!bVar1) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_40,fullpath,auto_format);
    std::filesystem::create_directories(&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
  }
  return;
}

Assistant:

FileKeyValueStore::FileKeyValueStore(std::string fullpath)
  : mImpl(std::make_unique<FileKeyValueStore::Impl>(fullpath))
{
  if (!fs::exists(fullpath)) {
      fs::create_directories(fullpath);
  }
}